

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool CLI::detail::split_windows_style(string *current,string *name,string *value)

{
  char *__s;
  bool bVar1;
  void *pvVar2;
  long lVar3;
  char *__data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (((current->_M_string_length < 2) || (__s = (current->_M_dataplus)._M_p, *__s != '/')) ||
     ((byte)__s[1] < 0x22 || __s[1] == 0x2d)) {
    bVar1 = false;
  }
  else {
    pvVar2 = memchr(__s,0x3a,current->_M_string_length);
    lVar3 = (long)pvVar2 - (long)__s;
    if (lVar3 == -1 || pvVar2 == (void *)0x0) {
      split_windows_style();
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_48,current,1,lVar3 - 1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (name,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_48,current,lVar3 + 1,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (value,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

CLI11_INLINE bool split_windows_style(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 1 && current[0] == '/' && valid_first_char(current[1])) {
        auto loc = current.find_first_of(':');
        if(loc != std::string::npos) {
            name = current.substr(1, loc - 1);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(1);
            value = "";
        }
        return true;
    }
    return false;
}